

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uchar * lodepng_chunk_next(uchar *chunk)

{
  uint uVar1;
  ulong uVar2;
  
  if (((((*chunk == 0x89) && (chunk[1] == 'P')) && (chunk[2] == 'N')) &&
      ((chunk[3] == 'G' && (chunk[4] == '\r')))) &&
     ((chunk[5] == '\n' && ((chunk[6] == '\x1a' && (chunk[7] == '\n')))))) {
    uVar2 = 8;
  }
  else {
    uVar1 = lodepng_read32bitInt(chunk);
    uVar2 = (ulong)(uVar1 + 0xc);
  }
  return chunk + uVar2;
}

Assistant:

unsigned char* lodepng_chunk_next(unsigned char* chunk) {
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
    return chunk + total_chunk_length;
  }
}